

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void addColorBits(uchar *out,size_t index,uint bits,uint in)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar2 = 7;
  if (bits != 1) {
    uVar2 = (uint)(bits == 2) * 2 + 1;
  }
  uVar4 = (uint)index & uVar2;
  uVar1 = bits * index >> 3;
  bVar3 = (byte)((~(-1 << ((byte)bits & 0x1f)) & in) <<
                (((char)uVar2 - (char)uVar4) * (byte)bits & 0x1f));
  if (uVar4 != 0) {
    out[uVar1] = out[uVar1] | bVar3;
    return;
  }
  out[uVar1] = bVar3;
  return;
}

Assistant:

static void addColorBits(unsigned char* out, size_t index, unsigned bits, unsigned in)
{
  unsigned m = bits == 1 ? 7 : bits == 2 ? 3 : 1; /*8 / bits - 1*/
  /*p = the partial index in the byte, e.g. with 4 palettebits it is 0 for first half or 1 for second half*/
  unsigned p = index & m;
  in &= (1u << bits) - 1u; /*filter out any other bits of the input value*/
  in = in << (bits * (m - p));
  if(p == 0) out[index * bits / 8] = in;
  else out[index * bits / 8] |= in;
}